

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O2

void printOperand(MCInst *MI,int OpNum,SStream *O)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  byte bVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint uVar6;
  MCOperand *op;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  
  if ((int)(uint)MI->size <= OpNum) {
    return;
  }
  op = MCInst_getOperand(MI,OpNum);
  _Var5 = MCOperand_isReg(op);
  if (_Var5) {
    uVar6 = MCOperand_getReg(op);
    SStream_concat0(O,getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar6 - 1) * 4));
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    bVar3 = (pcVar4->field_6).x86.prefix[0];
    if (MI->csh->doing_mem == true) {
      lVar8 = (ulong)bVar3 * 0x10;
      if (pcVar4->groups[lVar8 + 0x16] != '\0') {
        pcVar4->groups[lVar8 + 0x17] = (uint8_t)uVar6;
        return;
      }
      pcVar4->groups[lVar8 + 0x16] = (uint8_t)uVar6;
      return;
    }
    puVar2 = pcVar4->groups + (ulong)bVar3 * 0x10 + 0x12;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
  }
  else {
    _Var5 = MCOperand_isImm(op);
    if (!_Var5) {
      return;
    }
    uVar7 = MCOperand_getImm(op);
    uVar6 = (uint)uVar7;
    if ((int)uVar6 < 0) {
      uVar7 = (ulong)-uVar6;
      if (uVar6 < 0xfffffff7) {
        pcVar9 = "-0x%x";
      }
      else {
        pcVar9 = "-%u";
      }
    }
    else {
      if (uVar6 < 10) {
        pcVar9 = ", %u";
      }
      else {
        pcVar9 = ", 0x%x";
      }
      pcVar9 = pcVar9 + 2;
      uVar7 = uVar7 & 0xffffffff;
    }
    SStream_concat(O,pcVar9,uVar7);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    bVar3 = (pcVar4->field_6).x86.prefix[0];
    if (MI->csh->doing_mem == true) {
      *(uint *)(pcVar4->groups + (ulong)bVar3 * 0x10 + 0x1a) = uVar6;
      return;
    }
    puVar2 = pcVar4->groups + (ulong)bVar3 * 0x10 + 0x12;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
  }
  pcVar4 = MI->flat_insn->detail;
  *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x16) = uVar6;
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
}

Assistant:

static void printOperand(MCInst *MI, int opNum, SStream *O)
{
	int Imm;
	unsigned reg;
	MCOperand *MO = MCInst_getOperand(MI, opNum);

	if (MCOperand_isReg(MO)) {
		reg = MCOperand_getReg(MO);
		printRegName(O, reg);
		reg = Sparc_map_register(reg);

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base)
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.index = reg;
				else
					MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_REG;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].reg = reg;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}

		return;
	}

	if (MCOperand_isImm(MO)) {
		Imm = (int)MCOperand_getImm(MO);

		// Conditional branches displacements needs to be signextended to be
		// able to jump backwards.
		//
		// Displacements are measured as the number of instructions forward or
		// backward, so they need to be multiplied by 4
		switch (MI->Opcode) {
			case SP_CALL:
				Imm = SignExtend32(Imm, 30);
				Imm += (uint32_t)MI->address;
				break;

			// Branch on integer condition with prediction (BPcc)
			// Branch on floating point condition with prediction (FBPfcc)
			case SP_BPICC:
			case SP_BPICCA:
			case SP_BPICCANT:
			case SP_BPICCNT:
			case SP_BPXCC:
			case SP_BPXCCA:
			case SP_BPXCCANT:
			case SP_BPXCCNT:
			case SP_BPFCC:
			case SP_BPFCCA:
			case SP_BPFCCANT:
			case SP_BPFCCNT:
				Imm = SignExtend32(Imm, 19);
				Imm = (uint32_t)MI->address + Imm * 4;
				break;

			// Branch on integer condition (Bicc)
			// Branch on floating point condition (FBfcc)
			case SP_BA:
			case SP_BCOND:
			case SP_BCONDA:
			case SP_FBCOND:
			case SP_FBCONDA:
				Imm = SignExtend32(Imm, 22);
				Imm = (uint32_t)MI->address + Imm * 4;
				break;

			// Branch on integer register with prediction (BPr)
			case SP_BPGEZapn:
			case SP_BPGEZapt:
			case SP_BPGEZnapn:
			case SP_BPGEZnapt:
			case SP_BPGZapn:
			case SP_BPGZapt:
			case SP_BPGZnapn:
			case SP_BPGZnapt:
			case SP_BPLEZapn:
			case SP_BPLEZapt:
			case SP_BPLEZnapn:
			case SP_BPLEZnapt:
			case SP_BPLZapn:
			case SP_BPLZapt:
			case SP_BPLZnapn:
			case SP_BPLZnapt:
			case SP_BPNZapn:
			case SP_BPNZapt:
			case SP_BPNZnapn:
			case SP_BPNZnapt:
			case SP_BPZapn:
			case SP_BPZapt:
			case SP_BPZnapn:
			case SP_BPZnapt:
				Imm = SignExtend32(Imm, 16);
				Imm = (uint32_t)MI->address + Imm * 4;
				break;
		}

		if (Imm >= 0) {
			if (Imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", Imm);
			else
				SStream_concat(O, "%u", Imm);
		} else {
			if (Imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -Imm);
			else
				SStream_concat(O, "-%u", -Imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].type = SPARC_OP_IMM;
				MI->flat_insn->detail->sparc.operands[MI->flat_insn->detail->sparc.op_count].imm = Imm;
				MI->flat_insn->detail->sparc.op_count++;
			}
		}
	}

	return;
}